

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Function<kj::MainBuilder::Validity_()> * __thiscall
kj::Arena::
allocate<kj::Function<kj::MainBuilder::Validity()>,kj::Function<kj::MainBuilder::Validity()>>
          (Arena *this,Function<kj::MainBuilder::Validity_()> *params)

{
  Function<kj::MainBuilder::Validity_()> *location;
  Function<kj::MainBuilder::Validity_()> *params_00;
  Function<kj::MainBuilder::Validity_()> *result;
  Function<kj::MainBuilder::Validity_()> *params_local;
  Arena *this_local;
  
  location = (Function<kj::MainBuilder::Validity_()> *)allocateBytes(this,0x10,8,true);
  params_00 = fwd<kj::Function<kj::MainBuilder::Validity()>>(params);
  ctor<kj::Function<kj::MainBuilder::Validity()>,kj::Function<kj::MainBuilder::Validity()>>
            (location,params_00);
  setDestructor(this,location,destroyObject<kj::Function<kj::MainBuilder::Validity()>>);
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}